

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O0

void __thiscall icu_63::BMPSet::initBits(BMPSet *this)

{
  uint uVar1;
  int iVar2;
  int32_t local_3c;
  bool local_29;
  int local_20;
  int local_1c;
  int32_t minStart;
  int32_t listIndex;
  UChar32 limit;
  UChar32 start;
  BMPSet *this_local;
  
  local_1c = 0;
  do {
    iVar2 = local_1c + 1;
    listIndex = this->list[local_1c];
    if (iVar2 < this->listLength) {
      minStart = this->list[iVar2];
      local_1c = local_1c + 2;
    }
    else {
      minStart = 0x110000;
      local_1c = iVar2;
    }
    if (0xff < listIndex) break;
    do {
      iVar2 = listIndex + 1;
      this->latin1Contains[listIndex] = '\x01';
      local_29 = iVar2 < minStart && iVar2 < 0x100;
      listIndex = iVar2;
    } while (local_29);
  } while (minStart < 0x101);
  local_1c = 0;
  do {
    iVar2 = local_1c + 1;
    listIndex = this->list[local_1c];
    if (iVar2 < this->listLength) {
      minStart = this->list[iVar2];
      local_1c = local_1c + 2;
    }
    else {
      minStart = 0x110000;
      local_1c = iVar2;
    }
  } while (minStart < 0x81);
  if (listIndex < 0x80) {
    listIndex = 0x80;
  }
  do {
    if (0x7ff < listIndex) {
LAB_003c709d:
      local_20 = 0x800;
      while( true ) {
        if (0xffff < listIndex) {
          return;
        }
        if (0x10000 < minStart) {
          minStart = 0x10000;
        }
        if (listIndex < local_20) {
          listIndex = local_20;
        }
        if (listIndex < minStart) {
          if ((listIndex & 0x3fU) != 0) {
            uVar1 = listIndex >> 6 & 0x3f;
            this->bmpBlockBits[(int)uVar1] =
                 0x10001 << ((byte)(listIndex >> 0xc) & 0x1f) | this->bmpBlockBits[(int)uVar1];
            local_20 = ((listIndex >> 6) + 1U) * 0x40;
            listIndex = local_20;
          }
          if (listIndex < minStart) {
            uVar1 = minStart >> 6;
            if (listIndex < (int)(minStart & 0xffffffc0U)) {
              set32x64Bits(this->bmpBlockBits,listIndex >> 6,uVar1);
            }
            if ((minStart & 0x3fU) != 0) {
              this->bmpBlockBits[(int)(uVar1 & 0x3f)] =
                   0x10001 << ((byte)(minStart >> 0xc) & 0x1f) |
                   this->bmpBlockBits[(int)(uVar1 & 0x3f)];
              local_20 = (uVar1 + 1) * 0x40;
              minStart = local_20;
            }
          }
        }
        if (minStart == 0x10000) break;
        iVar2 = local_1c + 1;
        listIndex = this->list[local_1c];
        if (iVar2 < this->listLength) {
          minStart = this->list[iVar2];
          local_1c = local_1c + 2;
        }
        else {
          minStart = 0x110000;
          local_1c = iVar2;
        }
      }
      return;
    }
    if (minStart < 0x801) {
      local_3c = minStart;
    }
    else {
      local_3c = 0x800;
    }
    set32x64Bits(this->table7FF,listIndex,local_3c);
    if (0x800 < minStart) {
      listIndex = 0x800;
      goto LAB_003c709d;
    }
    iVar2 = local_1c + 1;
    listIndex = this->list[local_1c];
    if (iVar2 < this->listLength) {
      minStart = this->list[iVar2];
      local_1c = local_1c + 2;
    }
    else {
      minStart = 0x110000;
      local_1c = iVar2;
    }
  } while( true );
}

Assistant:

void BMPSet::initBits() {
    UChar32 start, limit;
    int32_t listIndex=0;

    // Set latin1Contains[].
    do {
        start=list[listIndex++];
        if(listIndex<listLength) {
            limit=list[listIndex++];
        } else {
            limit=0x110000;
        }
        if(start>=0x100) {
            break;
        }
        do {
            latin1Contains[start++]=1;
        } while(start<limit && start<0x100);
    } while(limit<=0x100);

    // Find the first range overlapping with (or after) 80..FF again,
    // to include them in table7FF as well.
    for(listIndex=0;;) {
        start=list[listIndex++];
        if(listIndex<listLength) {
            limit=list[listIndex++];
        } else {
            limit=0x110000;
        }
        if(limit>0x80) {
            if(start<0x80) {
                start=0x80;
            }
            break;
        }
    }

    // Set table7FF[].
    while(start<0x800) {
        set32x64Bits(table7FF, start, limit<=0x800 ? limit : 0x800);
        if(limit>0x800) {
            start=0x800;
            break;
        }

        start=list[listIndex++];
        if(listIndex<listLength) {
            limit=list[listIndex++];
        } else {
            limit=0x110000;
        }
    }

    // Set bmpBlockBits[].
    int32_t minStart=0x800;
    while(start<0x10000) {
        if(limit>0x10000) {
            limit=0x10000;
        }

        if(start<minStart) {
            start=minStart;
        }
        if(start<limit) {  // Else: Another range entirely in a known mixed-value block.
            if(start&0x3f) {
                // Mixed-value block of 64 code points.
                start>>=6;
                bmpBlockBits[start&0x3f]|=0x10001<<(start>>6);
                start=(start+1)<<6;  // Round up to the next block boundary.
                minStart=start;      // Ignore further ranges in this block.
            }
            if(start<limit) {
                if(start<(limit&~0x3f)) {
                    // Multiple all-ones blocks of 64 code points each.
                    set32x64Bits(bmpBlockBits, start>>6, limit>>6);
                }

                if(limit&0x3f) {
                    // Mixed-value block of 64 code points.
                    limit>>=6;
                    bmpBlockBits[limit&0x3f]|=0x10001<<(limit>>6);
                    limit=(limit+1)<<6;  // Round up to the next block boundary.
                    minStart=limit;      // Ignore further ranges in this block.
                }
            }
        }

        if(limit==0x10000) {
            break;
        }

        start=list[listIndex++];
        if(listIndex<listLength) {
            limit=list[listIndex++];
        } else {
            limit=0x110000;
        }
    }
}